

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceVkImpl::CreateShader
          (RenderDeviceVkImpl *this,ShaderCreateInfo *ShaderCI,IShader **ppShader,
          IDataBlob **ppCompilerOutput)

{
  anon_class_32_4_ae6e33d6 ConstructObject;
  CreateInfo VkShaderCI;
  IShader **local_38;
  _Head_base<0UL,_Diligent::IDXCompiler_*,_false> local_30;
  RenderDeviceInfo *local_28;
  GraphicsAdapterInfo *local_20;
  uint32_t local_18;
  undefined1 local_14;
  IDataBlob **local_10;
  IThreadPool *local_8;
  
  local_30._M_head_impl =
       (this->m_pDxCompiler)._M_t.
       super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>.
       _M_t.
       super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>.
       super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl;
  local_28 = &(this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo;
  local_20 = &(this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo;
  local_18 = ((this->m_PhysicalDevice)._M_t.
              super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              ._M_t.
              super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl)->
             m_VkVersion;
  local_14 = (((this->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_EnabledExtFeatures).Spirv14;
  local_8 = (this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_pShaderCompilationThreadPool.
            m_pObject;
  ConstructObject.ShaderCI = ShaderCI;
  ConstructObject.this = (RenderDeviceBase<Diligent::EngineVkImplTraits> *)this;
  ConstructObject.ExtraArgs = (CreateInfo *)&local_30;
  ConstructObject.ppShader = &local_38;
  local_38 = ppShader;
  local_10 = ppCompilerOutput;
  RenderDeviceBase<Diligent::EngineVkImplTraits>::
  CreateDeviceObject<Diligent::IShader,Diligent::ShaderDesc,Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateShaderImpl<Diligent::ShaderVkImpl::CreateInfo>(Diligent::IShader**,Diligent::ShaderCreateInfo_const&,Diligent::ShaderVkImpl::CreateInfo_const&)::_lambda()_1_>
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this,"Shader",&ShaderCI->Desc,
             ppShader,ConstructObject);
  return;
}

Assistant:

void RenderDeviceVkImpl::CreateShader(const ShaderCreateInfo& ShaderCI,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput)
{
    const ShaderVkImpl::CreateInfo VkShaderCI{
        GetDxCompiler(),
        GetDeviceInfo(),
        GetAdapterInfo(),
        GetVkVersion(),
        GetLogicalDevice().GetEnabledExtFeatures().Spirv14,
        ppCompilerOutput,
        m_pShaderCompilationThreadPool,
    };
    CreateShaderImpl(ppShader, ShaderCI, VkShaderCI);
}